

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O0

float compute_error_of_weight_set_1plane
                (endpoints_and_weights *eai,decimation_info *di,float *dec_weight_quant_uvalue)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  vfloat error_2;
  vfloat significance_2;
  vfloat diff_2;
  vfloat actual_values_2;
  vfloat current_values_2;
  uint i_2;
  vfloat error_1;
  vfloat significance_1;
  vfloat diff_1;
  vfloat actual_values_1;
  vfloat current_values_1;
  uint i_1;
  vfloat error;
  vfloat significance;
  vfloat diff;
  vfloat actual_values;
  vfloat current_values;
  uint i;
  uint texel_count;
  vfloatacc error_summav;
  undefined8 in_stack_ffffffffffffe8e0;
  float *in_stack_ffffffffffffe8e8;
  decimation_info *in_stack_ffffffffffffe8f0;
  uint local_16c4;
  undefined8 in_stack_ffffffffffffea60;
  float *in_stack_ffffffffffffea68;
  decimation_info *in_stack_ffffffffffffea70;
  uint local_1524;
  uint local_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  long local_1368;
  undefined1 local_1360 [216];
  undefined8 *local_1288;
  undefined1 local_1280 [56];
  undefined1 (*local_1248) [32];
  undefined1 local_1240 [56];
  undefined8 *local_1208;
  undefined1 local_1200 [56];
  undefined1 (*local_11c8) [32];
  undefined1 local_11c0 [128];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_10a0 [224];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [56];
  undefined8 uStack_f48;
  undefined8 uStack_f28;
  undefined1 local_f20 [32];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [32];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined1 local_e60 [176];
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined1 local_da0 [16];
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined1 local_d80 [24];
  undefined8 *local_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [16];
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [24];
  undefined8 *local_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined1 *local_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined1 *local_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined1 *local_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined1 *local_c28;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined1 *local_bc8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined1 (*local_b98) [32];
  undefined8 *local_b90;
  undefined1 (*local_b88) [32];
  undefined8 *local_b80;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined1 *local_b28;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 *local_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 *local_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 *local_a68;
  undefined1 local_9e0 [32];
  undefined1 *local_9a8;
  undefined1 local_9a0 [32];
  undefined1 *local_968;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 *local_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 *local_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 *local_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 *local_828;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 *local_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  float local_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 *local_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 *local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  float local_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 *local_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined1 local_360 [16];
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 *local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 *local_298;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90;
  float fStack_8c;
  float local_80;
  float fStack_7c;
  
  local_bb0 = 0;
  uStack_ba8 = 0;
  local_bc8 = local_1360;
  local_be0 = 0;
  uStack_bd8 = 0;
  local_1390 = 0;
  uStack_1388 = 0;
  uVar8 = (uint)*in_RSI;
  if (uVar8 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x2b7,
                  "float compute_error_of_weight_set_1plane(const endpoints_and_weights &, const decimation_info &, const float *)"
                 );
  }
  local_1368 = in_RDI;
  if (in_RSI[1] < 3) {
    if (in_RSI[1] < 2) {
      for (local_16c4 = 0; local_16c4 < uVar8; local_16c4 = local_16c4 + 8) {
        auVar2 = vsubps_avx(*(undefined1 (*) [32])(in_RDX + (ulong)local_16c4 * 4),
                            *(undefined1 (*) [32])(in_RDI + 0xa0 + (ulong)local_16c4 * 4));
        puVar1 = (undefined8 *)(in_RDI + 0x400 + (ulong)local_16c4 * 4);
        local_580 = auVar2._0_4_;
        fStack_57c = auVar2._4_4_;
        fStack_578 = auVar2._8_4_;
        fStack_574 = auVar2._12_4_;
        fStack_570 = auVar2._16_4_;
        fStack_56c = auVar2._20_4_;
        fStack_568 = auVar2._24_4_;
        fStack_564 = auVar2._28_4_;
        local_560 = (float)*puVar1;
        fStack_55c = (float)((ulong)*puVar1 >> 0x20);
        fStack_558 = (float)puVar1[1];
        fStack_554 = (float)((ulong)puVar1[1] >> 0x20);
        fStack_550 = (float)puVar1[2];
        fStack_54c = (float)((ulong)puVar1[2] >> 0x20);
        fStack_548 = (float)puVar1[3];
        local_140 = (float)local_1390;
        fStack_13c = (float)((ulong)local_1390 >> 0x20);
        fStack_138 = (float)uStack_1388;
        fStack_134 = (float)((ulong)uStack_1388 >> 0x20);
        local_1390 = CONCAT44(fStack_13c + fStack_57c * fStack_57c * fStack_55c +
                              fStack_56c * fStack_56c * fStack_54c,
                              local_140 + local_580 * local_580 * local_560 +
                              fStack_570 * fStack_570 * fStack_550);
        uStack_1388 = CONCAT44(fStack_134 + fStack_574 * fStack_574 * fStack_554 + fStack_564,
                               fStack_138 + fStack_578 * fStack_578 * fStack_558 +
                               fStack_568 * fStack_568 * fStack_548);
      }
    }
    else {
      local_1524 = 0;
      while( true ) {
        uVar11 = 0;
        uVar12 = 0;
        if (uVar8 <= local_1524) break;
        uVar9 = local_1390;
        uVar10 = uStack_1388;
        bilinear_infill_vla_2
                  (in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                   (uint)((ulong)in_stack_ffffffffffffe8e0 >> 0x20));
        local_1248 = (undefined1 (*) [32])(local_1368 + 0xa0 + (ulong)local_1524 * 4);
        local_1140 = *(undefined8 *)*local_1248;
        uStack_1138 = *(undefined8 *)(*local_1248 + 8);
        uStack_1130 = *(undefined8 *)(*local_1248 + 0x10);
        uStack_1128 = *(undefined8 *)(*local_1248 + 0x18);
        local_868 = local_1240;
        auVar2._8_8_ = uVar10;
        auVar2._0_8_ = uVar9;
        auVar2._16_8_ = uVar11;
        auVar2._24_8_ = uVar12;
        local_9a0 = vsubps_avx(auVar2,*local_1248);
        local_968 = local_1100;
        local_1288 = (undefined8 *)(local_1368 + 0x400 + (ulong)local_1524 * 4);
        local_fc0 = *local_1288;
        uStack_fb8 = local_1288[1];
        uStack_fb0 = local_1288[2];
        uStack_fa8 = local_1288[3];
        local_828 = local_1280;
        uStack_f28 = local_9a0._24_8_;
        uStack_f48 = local_9a0._24_8_;
        uStack_5e8 = local_9a0._24_8_;
        uVar9 = uStack_5e8;
        uStack_608 = local_9a0._24_8_;
        local_600 = local_9a0._0_4_;
        fStack_5fc = local_9a0._4_4_;
        fStack_5f8 = local_9a0._8_4_;
        fStack_5f4 = local_9a0._12_4_;
        fStack_5f0 = local_9a0._16_4_;
        fStack_5ec = local_9a0._20_4_;
        uStack_5e8._0_4_ = local_9a0._24_4_;
        uStack_5e8._4_4_ = local_9a0._28_4_;
        local_ae0 = local_600 * local_600;
        fStack_adc = fStack_5fc * fStack_5fc;
        fStack_ad8 = fStack_5f8 * fStack_5f8;
        fStack_ad4 = fStack_5f4 * fStack_5f4;
        fStack_ad0 = fStack_5f0 * fStack_5f0;
        fStack_acc = fStack_5ec * fStack_5ec;
        fStack_ac8 = (float)uStack_5e8 * (float)uStack_5e8;
        local_aa8 = local_f20;
        fStack_ac4 = uStack_5e8._4_4_;
        local_fa0 = CONCAT44(fStack_adc,local_ae0);
        uStack_f98 = CONCAT44(fStack_ad4,fStack_ad8);
        uStack_f90 = CONCAT44(fStack_acc,fStack_ad0);
        uStack_f88 = CONCAT44(uStack_5e8._4_4_,fStack_ac8);
        local_5e0._0_4_ = (float)local_fc0;
        local_5e0._4_4_ = (float)((ulong)local_fc0 >> 0x20);
        uStack_5d8._0_4_ = (float)uStack_fb8;
        uStack_5d8._4_4_ = (float)((ulong)uStack_fb8 >> 0x20);
        uStack_5d0._0_4_ = (float)uStack_fb0;
        uStack_5d0._4_4_ = (float)((ulong)uStack_fb0 >> 0x20);
        uStack_5c8._0_4_ = (float)uStack_fa8;
        local_aa0 = local_ae0 * (float)local_5e0;
        fStack_a9c = fStack_adc * local_5e0._4_4_;
        fStack_a98 = fStack_ad8 * (float)uStack_5d8;
        fStack_a94 = fStack_ad4 * uStack_5d8._4_4_;
        fStack_a90 = fStack_ad0 * (float)uStack_5d0;
        fStack_a8c = fStack_acc * uStack_5d0._4_4_;
        fStack_a88 = fStack_ac8 * (float)uStack_5c8;
        local_a68 = local_f80;
        fStack_a84 = uStack_5e8._4_4_;
        local_d90 = CONCAT44(fStack_a9c,local_aa0);
        uStack_d88 = CONCAT44(fStack_a94,fStack_a98);
        local_db0 = CONCAT44(fStack_a8c,fStack_a90);
        uStack_da8 = CONCAT44(uStack_5e8._4_4_,fStack_a88);
        local_d68 = &local_1390;
        local_c28 = local_d80;
        local_320 = local_1390;
        uStack_318 = uStack_1388;
        local_100._0_4_ = (float)local_1390;
        local_100._4_4_ = (float)((ulong)local_1390 >> 0x20);
        uStack_f8._0_4_ = (float)uStack_1388;
        uStack_f8._4_4_ = (float)((ulong)uStack_1388 >> 0x20);
        local_2b0 = (float)local_100 + local_aa0;
        fStack_2ac = local_100._4_4_ + fStack_a9c;
        fStack_2a8 = (float)uStack_f8 + fStack_a98;
        fStack_2a4 = uStack_f8._4_4_ + fStack_a94;
        local_298 = local_2c0;
        local_3c0 = CONCAT44(fStack_2ac,local_2b0);
        uStack_3b8 = CONCAT44(fStack_2a4,fStack_2a8);
        local_c48 = local_da0;
        local_350 = local_2b0 + fStack_a90;
        fStack_34c = fStack_2ac + fStack_a8c;
        fStack_348 = fStack_2a8 + fStack_a88;
        fStack_344 = fStack_2a4 + uStack_5e8._4_4_;
        local_338 = local_360;
        local_1390 = CONCAT44(fStack_34c,local_350);
        uStack_1388 = CONCAT44(fStack_344,fStack_348);
        local_1524 = local_1524 + 8;
        uStack_1110 = uVar11;
        uStack_1108 = uVar12;
        local_d60 = local_d90;
        uStack_d58 = uStack_d88;
        uStack_d50 = local_db0;
        uStack_d48 = uStack_da8;
        local_c60 = local_db0;
        uStack_c58 = uStack_da8;
        local_c40 = local_d90;
        uStack_c38 = uStack_d88;
        local_b88 = local_1248;
        local_b80 = local_1288;
        local_8a0 = local_1140;
        uStack_898 = uStack_1138;
        uStack_890 = uStack_1130;
        uStack_888 = uStack_1128;
        local_860 = local_fc0;
        uStack_858 = uStack_fb8;
        uStack_850 = uStack_fb0;
        uStack_848 = uStack_fa8;
        local_720 = local_1140;
        uStack_718 = uStack_1138;
        uStack_710 = uStack_1130;
        uStack_708 = uStack_1128;
        uStack_6f0 = uVar11;
        uStack_6e8 = uVar12;
        uStack_5e8 = uVar9;
        local_5e0 = local_fc0;
        uStack_5d8 = uStack_fb8;
        uStack_5d0 = uStack_fb0;
        uStack_5c8 = uStack_fa8;
        local_5c0 = local_fa0;
        uStack_5b8 = uStack_f98;
        uStack_5b0 = uStack_f90;
        uStack_5a8 = uStack_f88;
        local_3d0 = local_db0;
        uStack_3c8 = uStack_da8;
        local_3b0 = local_1390;
        uStack_3a8 = uStack_1388;
        local_398 = local_d68;
        local_390 = local_db0;
        uStack_388 = uStack_da8;
        local_380 = local_db0;
        uStack_378 = uStack_da8;
        local_370 = local_3c0;
        uStack_368 = uStack_3b8;
        local_330 = local_d90;
        uStack_328 = uStack_d88;
        local_310 = local_3c0;
        uStack_308 = uStack_3b8;
        local_2f8 = local_d68;
        local_2f0 = local_d90;
        uStack_2e8 = uStack_d88;
        local_2e0 = local_d90;
        uStack_2d8 = uStack_d88;
        local_2d0 = local_320;
        uStack_2c8 = uStack_318;
        local_110 = local_d90;
        uStack_108 = uStack_d88;
        local_100 = local_320;
        uStack_f8 = uStack_318;
        local_f0 = local_db0;
        uStack_e8 = uStack_da8;
        local_e0 = local_3c0;
        uStack_d8 = uStack_3b8;
      }
    }
  }
  else {
    local_1398 = 0;
    while( true ) {
      uVar11 = 0;
      uVar12 = 0;
      if (uVar8 <= local_1398) break;
      uVar9 = local_1390;
      uVar10 = uStack_1388;
      bilinear_infill_vla(in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,
                          (uint)((ulong)in_stack_ffffffffffffea60 >> 0x20));
      local_11c8 = (undefined1 (*) [32])(local_1368 + 0xa0 + (ulong)local_1398 * 4);
      local_10e0 = *(undefined8 *)*local_11c8;
      uStack_10d8 = *(undefined8 *)(*local_11c8 + 8);
      uStack_10d0 = *(undefined8 *)(*local_11c8 + 0x10);
      uStack_10c8 = *(undefined8 *)(*local_11c8 + 0x18);
      local_8e8 = local_11c0;
      auVar4._8_8_ = uVar10;
      auVar4._0_8_ = uVar9;
      auVar4._16_8_ = uVar11;
      auVar4._24_8_ = uVar12;
      local_9e0 = vsubps_avx(auVar4,*local_11c8);
      local_9a8 = local_10a0;
      local_1208 = (undefined8 *)(local_1368 + 0x400 + (ulong)local_1398 * 4);
      local_f00 = *local_1208;
      uStack_ef8 = local_1208[1];
      uStack_ef0 = local_1208[2];
      uStack_ee8 = local_1208[3];
      local_8a8 = local_1200;
      local_e80 = local_9e0._0_8_;
      uStack_e78 = local_9e0._8_8_;
      uStack_e70 = local_9e0._16_8_;
      uStack_e68 = local_9e0._24_8_;
      local_ea0 = local_9e0._0_8_;
      uStack_e98 = local_9e0._8_8_;
      uStack_e90 = local_9e0._16_8_;
      uStack_e88 = local_9e0._24_8_;
      local_680 = local_9e0._0_8_;
      uVar9 = local_680;
      uStack_678 = local_9e0._8_8_;
      uVar10 = uStack_678;
      uStack_670 = local_9e0._16_8_;
      uVar6 = uStack_670;
      uStack_668 = local_9e0._24_8_;
      uVar7 = uStack_668;
      local_6a0 = local_9e0._0_8_;
      uStack_698 = local_9e0._8_8_;
      uStack_690 = local_9e0._16_8_;
      uStack_688 = local_9e0._24_8_;
      local_680._0_4_ = local_9e0._0_4_;
      local_680._4_4_ = local_9e0._4_4_;
      uStack_678._0_4_ = local_9e0._8_4_;
      uStack_678._4_4_ = local_9e0._12_4_;
      uStack_670._0_4_ = local_9e0._16_4_;
      uStack_670._4_4_ = local_9e0._20_4_;
      uStack_668._0_4_ = local_9e0._24_4_;
      uStack_668._4_4_ = local_9e0._28_4_;
      local_b60 = (float)local_680 * (float)local_680;
      fStack_b5c = local_680._4_4_ * local_680._4_4_;
      fStack_b58 = (float)uStack_678 * (float)uStack_678;
      fStack_b54 = uStack_678._4_4_ * uStack_678._4_4_;
      fStack_b50 = (float)uStack_670 * (float)uStack_670;
      fStack_b4c = uStack_670._4_4_ * uStack_670._4_4_;
      fStack_b48 = (float)uStack_668 * (float)uStack_668;
      local_b28 = local_e60;
      fStack_b44 = uStack_668._4_4_;
      local_ee0 = CONCAT44(fStack_b5c,local_b60);
      uStack_ed8 = CONCAT44(fStack_b54,fStack_b58);
      uStack_ed0 = CONCAT44(fStack_b4c,fStack_b50);
      uStack_ec8 = CONCAT44(uStack_668._4_4_,fStack_b48);
      local_660._0_4_ = (float)local_f00;
      local_660._4_4_ = (float)((ulong)local_f00 >> 0x20);
      uStack_658._0_4_ = (float)uStack_ef8;
      uStack_658._4_4_ = (float)((ulong)uStack_ef8 >> 0x20);
      uStack_650._0_4_ = (float)uStack_ef0;
      uStack_650._4_4_ = (float)((ulong)uStack_ef0 >> 0x20);
      uStack_648._0_4_ = (float)uStack_ee8;
      local_b20 = local_b60 * (float)local_660;
      fStack_b1c = fStack_b5c * local_660._4_4_;
      fStack_b18 = fStack_b58 * (float)uStack_658;
      fStack_b14 = fStack_b54 * uStack_658._4_4_;
      fStack_b10 = fStack_b50 * (float)uStack_650;
      fStack_b0c = fStack_b4c * uStack_650._4_4_;
      fStack_b08 = fStack_b48 * (float)uStack_648;
      local_ae8 = local_ec0;
      fStack_b04 = uStack_668._4_4_;
      local_d10 = CONCAT44(fStack_b1c,local_b20);
      uStack_d08 = CONCAT44(fStack_b14,fStack_b18);
      local_d30 = CONCAT44(fStack_b0c,fStack_b10);
      uStack_d28 = CONCAT44(uStack_668._4_4_,fStack_b08);
      local_ce8 = &local_1390;
      local_c68 = local_d00;
      local_460 = local_1390;
      uStack_458 = uStack_1388;
      local_c0._0_4_ = (float)local_1390;
      local_c0._4_4_ = (float)((ulong)local_1390 >> 0x20);
      uStack_b8._0_4_ = (float)uStack_1388;
      uStack_b8._4_4_ = (float)((ulong)uStack_1388 >> 0x20);
      local_3f0 = (float)local_c0 + local_b20;
      fStack_3ec = local_c0._4_4_ + fStack_b1c;
      fStack_3e8 = (float)uStack_b8 + fStack_b18;
      fStack_3e4 = uStack_b8._4_4_ + fStack_b14;
      local_3d8 = local_400;
      local_500 = CONCAT44(fStack_3ec,local_3f0);
      uStack_4f8 = CONCAT44(fStack_3e4,fStack_3e8);
      local_c88 = local_d20;
      local_490 = local_3f0 + fStack_b10;
      fStack_48c = fStack_3ec + fStack_b0c;
      fStack_488 = fStack_3e8 + fStack_b08;
      fStack_484 = fStack_3e4 + uStack_668._4_4_;
      local_478 = local_4a0;
      local_1390 = CONCAT44(fStack_48c,local_490);
      uStack_1388 = CONCAT44(fStack_484,fStack_488);
      local_1398 = local_1398 + 8;
      uStack_10b0 = uVar11;
      uStack_10a8 = uVar12;
      local_ce0 = local_d10;
      uStack_cd8 = uStack_d08;
      uStack_cd0 = local_d30;
      uStack_cc8 = uStack_d28;
      local_ca0 = local_d30;
      uStack_c98 = uStack_d28;
      local_c80 = local_d10;
      uStack_c78 = uStack_d08;
      local_b98 = local_11c8;
      local_b90 = local_1208;
      local_920 = local_10e0;
      uStack_918 = uStack_10d8;
      uStack_910 = uStack_10d0;
      uStack_908 = uStack_10c8;
      local_8e0 = local_f00;
      uStack_8d8 = uStack_ef8;
      uStack_8d0 = uStack_ef0;
      uStack_8c8 = uStack_ee8;
      local_760 = local_10e0;
      uStack_758 = uStack_10d8;
      uStack_750 = uStack_10d0;
      uStack_748 = uStack_10c8;
      uStack_730 = uVar11;
      uStack_728 = uVar12;
      local_680 = uVar9;
      uStack_678 = uVar10;
      uStack_670 = uVar6;
      uStack_668 = uVar7;
      local_660 = local_f00;
      uStack_658 = uStack_ef8;
      uStack_650 = uStack_ef0;
      uStack_648 = uStack_ee8;
      local_640 = local_ee0;
      uStack_638 = uStack_ed8;
      uStack_630 = uStack_ed0;
      uStack_628 = uStack_ec8;
      local_510 = local_d30;
      uStack_508 = uStack_d28;
      local_4f0 = local_1390;
      uStack_4e8 = uStack_1388;
      local_4d8 = local_ce8;
      local_4d0 = local_d30;
      uStack_4c8 = uStack_d28;
      local_4c0 = local_d30;
      uStack_4b8 = uStack_d28;
      local_4b0 = local_500;
      uStack_4a8 = uStack_4f8;
      local_470 = local_d10;
      uStack_468 = uStack_d08;
      local_450 = local_500;
      uStack_448 = uStack_4f8;
      local_438 = local_ce8;
      local_430 = local_d10;
      uStack_428 = uStack_d08;
      local_420 = local_d10;
      uStack_418 = uStack_d08;
      local_410 = local_460;
      uStack_408 = uStack_458;
      local_d0 = local_d10;
      uStack_c8 = uStack_d08;
      local_c0 = local_460;
      uStack_b8 = uStack_458;
      local_b0 = local_d30;
      uStack_a8 = uStack_d28;
      local_a0 = local_500;
      uStack_98 = uStack_4f8;
    }
  }
  auVar5._8_8_ = uStack_1388;
  auVar5._0_8_ = local_1390;
  auVar3._8_8_ = uStack_1388;
  auVar3._0_8_ = local_1390;
  auVar3 = vunpckhpd_avx(auVar3,auVar5);
  local_80 = (float)local_1390;
  fStack_7c = (float)((ulong)local_1390 >> 0x20);
  local_90 = auVar3._0_4_;
  fStack_8c = auVar3._4_4_;
  return local_80 + local_90 + fStack_7c + fStack_8c;
}

Assistant:

float compute_error_of_weight_set_1plane(
	const endpoints_and_weights& eai,
	const decimation_info& di,
	const float* dec_weight_quant_uvalue
) {
	vfloatacc error_summav = vfloatacc::zero();
	unsigned int texel_count = di.texel_count;
	promise(texel_count > 0);

	// Process SIMD-width chunks, safe to over-fetch - the extra space is zero initialized
	if (di.max_texel_weight_count > 2)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values = bilinear_infill_vla(di, dec_weight_quant_uvalue, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}
	else if (di.max_texel_weight_count > 1)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values = bilinear_infill_vla_2(di, dec_weight_quant_uvalue, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}
	else
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Load the weight set directly, without interpolation
			vfloat current_values = loada(dec_weight_quant_uvalue + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}

	// Resolve the final scalar accumulator sum
	return hadd_s(error_summav);
}